

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spot.c
# Opt level: O2

Spot * spot_dup(Spot *spot)

{
  byte bVar1;
  Spot *pSVar2;
  Card **ppCVar3;
  Card *pCVar4;
  ulong uVar5;
  
  pSVar2 = spot_create(spot->type,spot->index);
  bVar1 = spot->cardsCount;
  ppCVar3 = (Card **)malloc((ulong)bVar1 << 3);
  pSVar2->cards = ppCVar3;
  pSVar2->cardsCount = bVar1;
  for (uVar5 = 0; uVar5 < bVar1; uVar5 = uVar5 + 1) {
    pCVar4 = card_dup(spot->cards[uVar5]);
    ppCVar3[uVar5] = pCVar4;
    bVar1 = spot->cardsCount;
  }
  return pSVar2;
}

Assistant:

Spot * spot_dup(Spot * spot)
{
	unsigned char i;
	Spot * dupSpot = spot_create(spot->type, spot->index);
	dupSpot->cards = (Card **)malloc(sizeof(Card *)*spot->cardsCount);
	dupSpot->cardsCount = spot->cardsCount;
	for(i=0;i<spot->cardsCount;i++)
	{
		dupSpot->cards[i] = card_dup(spot->cards[i]);
	}
	return dupSpot;
}